

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Cmd::nextLine_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Cmd *this,bool mask_mode)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  string_view str;
  char buf [4096];
  undefined8 uStack_1030;
  string asStack_1028 [128];
  
  uStack_1030 = 0x102ac1;
  iVar3 = isatty(this->in_fd_);
  if (iVar3 == 0) {
    uStack_1030 = 0x102b34;
    readlineNoTTY_abi_cxx11_(asStack_1028,this);
    uStack_1030 = 0x102b3f;
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (__return_storage_ptr__,asStack_1028);
    uStack_1030 = 0x102b47;
    std::__cxx11::string::~string((string *)asStack_1028);
  }
  else {
    uStack_1030 = 0x102aca;
    bVar2 = isUnsupportedTerm();
    if (bVar2) {
      uStack_1030 = 0x102add;
      str._M_str = (this->prompt)._M_dataplus._M_p;
      str._M_len = (this->prompt)._M_string_length;
      write_string(this,str);
      uStack_1030 = 0x102ae6;
      fflush((FILE *)this->out_);
      uStack_1030 = 0x102af7;
      pcVar4 = fgets((char *)asStack_1028,0x1000,(FILE *)this->in_);
      if (pcVar4 == (char *)0x0) {
        (__return_storage_ptr__->
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged = false;
      }
      else {
        uStack_1030 = 0x102b04;
        sVar5 = strlen((char *)asStack_1028);
        while ((sVar5 != 0 &&
               ((cVar1 = *(char *)((long)asStack_1028 + (sVar5 - 1)), cVar1 == '\r' ||
                (cVar1 == '\n'))))) {
          *(undefined1 *)((long)asStack_1028 + (sVar5 - 1)) = 0;
          sVar5 = sVar5 - 1;
        }
        uStack_1030 = 0x102b65;
        std::
        _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_Optional_payload_base<char[4096]>
                  ((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)__return_storage_ptr__,asStack_1028);
      }
    }
    else {
      uStack_1030 = 0x102b58;
      readlineRaw_abi_cxx11_(__return_storage_ptr__,this,mask_mode);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> nextLine(bool mask_mode = false) {
		if (!isatty(in_fd_)) {
			// Not a tty: read from file / pipe.
			return readlineNoTTY();
		} else if (isUnsupportedTerm()) {

			write_string(prompt);
			fflush(out_);

			char buf[MaxLineLength];
			if (fgets(buf, sizeof(buf), in_) == nullptr) {
				return {};
			}

			size_t len = strlen(buf);
			while (len != 0 && (buf[len - 1] == '\n' || buf[len - 1] == '\r')) {
				buf[--len] = '\0';
			}

			return buf;
		} else {
			return readlineRaw(mask_mode);
		}
	}